

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_export(ptls_t *tls,ptls_buffer_t *output)

{
  char *p;
  size_t sVar1;
  uint16_t uVar2;
  int iVar3;
  ulong uVar4;
  ptls_iovec_t negotiated_protocol_00;
  size_t local_158;
  size_t local_130;
  size_t body_size;
  size_t body_size_4;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  uint64_t local_f0;
  uint64_t _v_3;
  uint64_t local_e0;
  uint64_t _v_2;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t len;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t local_88;
  undefined1 local_86;
  undefined1 local_85;
  undefined2 local_84;
  byte local_82;
  byte local_81;
  uint16_t _v_1;
  uint16_t _v;
  size_t body_start;
  size_t capacity;
  ptls_iovec_t _negotiated_protocol;
  char *_server_name;
  uint8_t *puStack_50;
  int ret;
  ptls_iovec_t negotiated_protocol;
  ptls_buffer_t *output_local;
  ptls_t *tls_local;
  
  p = tls->negotiated_protocol;
  if (tls->negotiated_protocol == (char *)0x0) {
    local_130 = 0;
  }
  else {
    local_130 = strlen(tls->negotiated_protocol);
  }
  negotiated_protocol_00 = ptls_iovec_init(p,local_130);
  if (tls->state == PTLS_STATE_SERVER_POST_HANDSHAKE) {
    uVar2 = ptls_get_protocol_version(tls);
    puStack_50 = negotiated_protocol_00.base;
    negotiated_protocol.base = (uint8_t *)negotiated_protocol_00.len;
    if (uVar2 == 0x304) {
      _negotiated_protocol.len = (size_t)tls->server_name;
      capacity = (size_t)puStack_50;
      _negotiated_protocol.base = negotiated_protocol.base;
      body_start = 2;
      _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
      if (_server_name._4_4_ == 0) {
        __v_1 = output->off;
        local_81 = tls->field_0x1e8 & 1;
        _server_name._4_4_ = ptls_buffer__do_pushv(output,&local_81,1);
        if (_server_name._4_4_ == 0) {
          local_82 = (byte)tls->field_0x1e8 >> 1 & 1;
          _server_name._4_4_ = ptls_buffer__do_pushv(output,&local_82,1);
          if (_server_name._4_4_ == 0) {
            local_84 = 0x304;
            local_86 = 3;
            local_85 = 4;
            _server_name._4_4_ = ptls_buffer__do_pushv(output,&local_86,2);
            if (_server_name._4_4_ == 0) {
              local_88 = tls->cipher_suite->id;
              capacity_1._6_1_ = (undefined1)(local_88 >> 8);
              capacity_1._7_1_ = (undefined1)local_88;
              _server_name._4_4_ = ptls_buffer__do_pushv(output,(void *)((long)&capacity_1 + 6),2);
              if ((_server_name._4_4_ == 0) &&
                 (_server_name._4_4_ = ptls_buffer__do_pushv(output,tls->client_random,0x20),
                 _server_name._4_4_ == 0)) {
                body_start_1 = 2;
                _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
                if (_server_name._4_4_ == 0) {
                  len = output->off;
                  if (_negotiated_protocol.len == 0) {
                    local_158 = 0;
                  }
                  else {
                    local_158 = strlen((char *)_negotiated_protocol.len);
                  }
                  body_size_1 = local_158;
                  _server_name._4_4_ =
                       ptls_buffer__do_pushv(output,(void *)_negotiated_protocol.len,local_158);
                  if (_server_name._4_4_ == 0) {
                    capacity_2 = output->off - len;
                    if (body_start_1 == 0xffffffffffffffff) {
                      iVar3 = ptls_buffer__adjust_quic_blocksize(output,capacity_2);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                    }
                    else {
                      if ((body_start_1 < 8) &&
                         ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= capacity_2)) {
                        return 0x20c;
                      }
                      for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                        output->base[len - body_start_1] =
                             (uint8_t)(capacity_2 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                      }
                    }
                    body_start_2 = 2;
                    _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
                    if (_server_name._4_4_ == 0) {
                      body_size_2 = output->off;
                      _server_name._4_4_ =
                           ptls_buffer__do_pushv
                                     (output,(void *)capacity,(size_t)_negotiated_protocol.base);
                      if (_server_name._4_4_ == 0) {
                        capacity_3 = output->off - body_size_2;
                        if (body_start_2 == 0xffffffffffffffff) {
                          iVar3 = ptls_buffer__adjust_quic_blocksize(output,capacity_3);
                          if (iVar3 != 0) {
                            return iVar3;
                          }
                        }
                        else {
                          if ((body_start_2 < 8) &&
                             ((ulong)(1L << ((byte)(body_start_2 << 3) & 0x3f)) <= capacity_3)) {
                            return 0x20c;
                          }
                          for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                            output->base[body_size_2 - body_start_2] =
                                 (uint8_t)(capacity_3 >> (((char)body_start_2 + -1) * '\b' & 0x3fU))
                            ;
                          }
                        }
                        body_start_3 = 2;
                        _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
                        if (_server_name._4_4_ == 0) {
                          _v_2 = output->off;
                          _server_name._4_4_ =
                               ptls_buffer__do_pushv
                                         (output,&(tls->traffic_protection).enc,
                                          tls->cipher_suite->hash->digest_size);
                          if (_server_name._4_4_ == 0) {
                            local_e0 = (tls->traffic_protection).enc.seq;
                            _v_3._0_1_ = (undefined1)(local_e0 >> 0x38);
                            _v_3._1_1_ = (undefined1)(local_e0 >> 0x30);
                            _v_3._2_1_ = (undefined1)(local_e0 >> 0x28);
                            _v_3._3_1_ = (undefined1)(local_e0 >> 0x20);
                            _v_3._4_1_ = (undefined1)(local_e0 >> 0x18);
                            _v_3._5_1_ = (undefined1)(local_e0 >> 0x10);
                            _v_3._6_1_ = (undefined1)(local_e0 >> 8);
                            _v_3._7_1_ = (undefined1)local_e0;
                            _server_name._4_4_ = ptls_buffer__do_pushv(output,&_v_3,8);
                            if ((_server_name._4_4_ == 0) &&
                               (_server_name._4_4_ =
                                     ptls_buffer__do_pushv
                                               (output,&tls->traffic_protection,
                                                tls->cipher_suite->hash->digest_size),
                               _server_name._4_4_ == 0)) {
                              local_f0 = (tls->traffic_protection).dec.seq;
                              body_size_3._0_1_ = (undefined1)(local_f0 >> 0x38);
                              body_size_3._1_1_ = (undefined1)(local_f0 >> 0x30);
                              body_size_3._2_1_ = (undefined1)(local_f0 >> 0x28);
                              body_size_3._3_1_ = (undefined1)(local_f0 >> 0x20);
                              body_size_3._4_1_ = (undefined1)(local_f0 >> 0x18);
                              body_size_3._5_1_ = (undefined1)(local_f0 >> 0x10);
                              body_size_3._6_1_ = (undefined1)(local_f0 >> 8);
                              body_size_3._7_1_ = (undefined1)local_f0;
                              _server_name._4_4_ = ptls_buffer__do_pushv(output,&body_size_3,8);
                              if (_server_name._4_4_ == 0) {
                                uVar4 = output->off - _v_2;
                                if (body_start_3 == 0xffffffffffffffff) {
                                  iVar3 = ptls_buffer__adjust_quic_blocksize(output,uVar4);
                                  if (iVar3 != 0) {
                                    return iVar3;
                                  }
                                }
                                else {
                                  if ((body_start_3 < 8) &&
                                     ((ulong)(1L << ((byte)(body_start_3 << 3) & 0x3f)) <= uVar4)) {
                                    return 0x20c;
                                  }
                                  for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
                                    output->base[_v_2 - body_start_3] =
                                         (uint8_t)(uVar4 >> (((char)body_start_3 + -1) * '\b' &
                                                            0x3fU));
                                  }
                                }
                                body_start_4 = 2;
                                _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
                                if (_server_name._4_4_ == 0) {
                                  sVar1 = output->off;
                                  uVar4 = output->off - sVar1;
                                  if (uVar4 < 0x10000) {
                                    for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                                      output->base[sVar1 - body_start_4] =
                                           (uint8_t)(uVar4 >> (((char)body_start_4 + -1) * '\b' &
                                                              0x3fU));
                                    }
                                    uVar4 = output->off - __v_1;
                                    if (body_start == 0xffffffffffffffff) {
                                      iVar3 = ptls_buffer__adjust_quic_blocksize(output,uVar4);
                                      if (iVar3 != 0) {
                                        return iVar3;
                                      }
                                    }
                                    else {
                                      if ((body_start < 8) &&
                                         ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= uVar4))
                                      {
                                        return 0x20c;
                                      }
                                      for (; body_start != 0; body_start = body_start - 1) {
                                        output->base[__v_1 - body_start] =
                                             (uint8_t)(uVar4 >> (((char)body_start + -1) * '\b' &
                                                                0x3fU));
                                      }
                                    }
                                    _server_name._4_4_ = 0;
                                  }
                                  else {
                                    _server_name._4_4_ = 0x20c;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      _server_name._4_4_ =
           export_tls12_params(output,(uint)(tls->field_0x1e8 & 1),
                               (uint)((byte)tls->field_0x1e8 >> 1 & 1),tls->cipher_suite,
                               tls->client_random,tls->server_name,negotiated_protocol_00,
                               &(tls->traffic_protection).enc,
                               (tls->traffic_protection).enc.secret + 0x20,
                               (tls->traffic_protection).enc.seq,
                               (tls->traffic_protection).enc.tls12_enc_record_iv,
                               &tls->traffic_protection,(tls->traffic_protection).dec.secret + 0x20,
                               (tls->traffic_protection).dec.seq);
    }
  }
  else {
    _server_name._4_4_ = 0x203;
  }
  return _server_name._4_4_;
}

Assistant:

int ptls_export(ptls_t *tls, ptls_buffer_t *output)
{
    ptls_iovec_t negotiated_protocol =
        ptls_iovec_init(tls->negotiated_protocol, tls->negotiated_protocol != NULL ? strlen(tls->negotiated_protocol) : 0);
    int ret;

    if (tls->state != PTLS_STATE_SERVER_POST_HANDSHAKE) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    if (ptls_get_protocol_version(tls) == PTLS_PROTOCOL_VERSION_TLS13) {
        export_tls_params(output, tls->is_server, tls->is_psk_handshake, PTLS_PROTOCOL_VERSION_TLS13, tls->cipher_suite,
                          tls->client_random, tls->server_name, negotiated_protocol, {
                              ptls_buffer_pushv(output, tls->traffic_protection.enc.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.enc.seq);
                              ptls_buffer_pushv(output, tls->traffic_protection.dec.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.dec.seq);
                          });
        ret = 0;
    } else {
        if ((ret = export_tls12_params(output, tls->is_server, tls->is_psk_handshake, tls->cipher_suite, tls->client_random,
                                       tls->server_name, negotiated_protocol, tls->traffic_protection.enc.secret,
                                       tls->traffic_protection.enc.secret + PTLS_MAX_SECRET_SIZE, tls->traffic_protection.enc.seq,
                                       tls->traffic_protection.enc.tls12_enc_record_iv, tls->traffic_protection.dec.secret,
                                       tls->traffic_protection.dec.secret + PTLS_MAX_SECRET_SIZE,
                                       tls->traffic_protection.dec.seq)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}